

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_locate(int *x,int *y)

{
  term_win *ptVar1;
  
  ptVar1 = Term->scr;
  *x = ptVar1->cx;
  *y = ptVar1->cy;
  return (errr)ptVar1->cu;
}

Assistant:

errr Term_locate(int *x, int *y)
{
	/* Access the cursor */
	(*x) = Term->scr->cx;
	(*y) = Term->scr->cy;

	/* Warn about "useless" cursor */
	if (Term->scr->cu) return (1);

	/* Success */
	return (0);
}